

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O0

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Insert
          (CASC_FILE_TREE *this,PCONTENT_KEY pCKey,char *szFullPath,DWORD DataId,DWORD FileSize,
          DWORD LocaleId)

{
  char cVar1;
  size_t sVar2;
  ushort uVar3;
  size_t sStack_468;
  char chOneChar;
  size_t i;
  uchar local_458 [4];
  DWORD Parent;
  char szNormPath [1025];
  char *local_48;
  char *szNodeBegin;
  PCASC_FILE_NODE pFileNode;
  DWORD LocaleId_local;
  DWORD FileSize_local;
  DWORD DataId_local;
  char *szFullPath_local;
  PCONTENT_KEY pCKey_local;
  CASC_FILE_TREE *this_local;
  
  szNodeBegin = (char *)0x0;
  i._4_4_ = 0;
  sStack_468 = 0;
  local_48 = szFullPath;
  do {
    if (szFullPath[sStack_468] == '\0') {
      if ((local_48 < szFullPath + sStack_468) &&
         (szNodeBegin = (char *)GetOrInsert(this,(char *)local_458,sStack_468,local_48,
                                            szFullPath + sStack_468,pCKey,i._4_4_,DataId),
         (PCASC_FILE_NODE)szNodeBegin != (PCASC_FILE_NODE)0x0)) {
        SetExtras(this,(PCASC_FILE_NODE)szNodeBegin,FileSize,LocaleId);
      }
      return (PCASC_FILE_NODE)szNodeBegin;
    }
    cVar1 = szFullPath[sStack_468];
    if (((cVar1 == '\\') || (cVar1 == '/')) || (cVar1 == ':')) {
      szNodeBegin = (char *)GetOrInsert(this,(char *)local_458,sStack_468,local_48,
                                        szFullPath + sStack_468,(PCONTENT_KEY)0x0,i._4_4_,0xffffffff
                                       );
      if ((PCASC_FILE_NODE)szNodeBegin == (PCASC_FILE_NODE)0x0) {
        return (PCASC_FILE_NODE)0x0;
      }
      uVar3 = 0;
      if (cVar1 == ':') {
        uVar3 = 2;
      }
      ((PCASC_FILE_NODE)szNodeBegin)->Flags = ((PCASC_FILE_NODE)szNodeBegin)->Flags | uVar3;
      ((PCASC_FILE_NODE)szNodeBegin)->Flags = ((PCASC_FILE_NODE)szNodeBegin)->Flags | 1;
      sVar2 = CASC_ARRAY::IndexOf(&this->FileTable,szNodeBegin);
      i._4_4_ = (DWORD)sVar2;
      local_48 = szFullPath + sStack_468 + 1;
    }
    local_458[sStack_468] = AsciiToUpperTable_BkSlash[cVar1];
    sStack_468 = sStack_468 + 1;
  } while( true );
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Insert(PCONTENT_KEY pCKey, const char * szFullPath, DWORD DataId, DWORD FileSize, DWORD LocaleId)
{
    PCASC_FILE_NODE pFileNode = NULL;
    const char * szNodeBegin = szFullPath;
    char szNormPath[MAX_PATH+1];
    DWORD Parent = 0;
    size_t i;

    // Traverse the entire path and make sure that all subdirs are there
    for(i = 0; szFullPath[i] != 0; i++)
    {
        char chOneChar = szFullPath[i];

        // Is there a path separator?
        // Note: Warcraft III paths may contain "mount points".
        // Example: "frFR-War3Local.mpq:Maps/FrozenThrone/Campaign/NightElfX06Interlude.w3x:war3map.j"
        if(chOneChar == '\\' || chOneChar == '/' || chOneChar == ':')
        {
            pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, NULL, Parent, CASC_INVALID_ID);
            if(pFileNode == NULL)
                return NULL;

            // Supply the missing values
            pFileNode->Flags |= (chOneChar == ':') ? CFN_FLAG_MOUNT_POINT : 0;
            pFileNode->Flags |= CFN_FLAG_FOLDER;

            // Get the new parent item
            Parent = (DWORD)FileTable.IndexOf(pFileNode);

            // Also reset the begin of the node
            szNodeBegin = szFullPath + i + 1;
        }

        // Copy the next character, even if it was slash/backslash before
        szNormPath[i] = AsciiToUpperTable_BkSlash[chOneChar];
    }

    // If there is anything left, we insert it as file name
    if((szFullPath + i) > szNodeBegin)
    {
        pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, pCKey, Parent, DataId);
        if(pFileNode != NULL)
        {
            SetExtras(pFileNode, FileSize, LocaleId);
        }
    }

    // Return the file node
    return pFileNode;
}